

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

connectdata * Curl_cpool_get_conn(Curl_easy *data,curl_off_t conn_id)

{
  Curl_share *pCVar1;
  Curl_multi *pCVar2;
  cpool *cpool;
  cpool_find_ctx fctx;
  curl_off_t local_18;
  connectdata *local_10;
  
  if (data == (Curl_easy *)0x0) {
LAB_0011a73a:
    local_10 = (connectdata *)0x0;
  }
  else {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      pCVar2 = data->multi_easy;
      if ((pCVar2 == (Curl_multi *)0x0) && (pCVar2 = data->multi, pCVar2 == (Curl_multi *)0x0))
      goto LAB_0011a73a;
      cpool = &pCVar2->cpool;
    }
    else {
      cpool = &pCVar1->cpool;
    }
    local_10 = (connectdata *)0x0;
    local_18 = conn_id;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x98 = cpool->field_0x98 | 1;
    cpool_foreach(cpool->idata,cpool,&local_18,cpool_find_conn);
    cpool->field_0x98 = cpool->field_0x98 & 0xfe;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
    }
  }
  return local_10;
}

Assistant:

static struct cpool *cpool_get_instance(struct Curl_easy *data)
{
  if(data) {
    if(CURL_SHARE_KEEP_CONNECT(data->share))
      return &data->share->cpool;
    else if(data->multi_easy)
      return &data->multi_easy->cpool;
    else if(data->multi)
      return &data->multi->cpool;
  }
  return NULL;
}